

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_merge_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>>>
          (merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *ranges)

{
  owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *in_RCX;
  owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_48;
  owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_30;
  burst *local_18;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  *ranges_local;
  
  local_18 = this;
  ranges_local = (iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                  *)__return_storage_ptr__;
  std::
  begin<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>>>
            (&local_30,
             (iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
              *)this);
  std::
  end<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>>>
            (&local_48,
             (iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
              *)local_18);
  make_merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>>
            (__return_storage_ptr__,(burst *)&local_30,&local_48,in_RCX);
  owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~owning_iterator(&local_48);
  owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~owning_iterator(&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto make_merge_iterator (RandomAccessRange && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_merge_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges))
            );
    }